

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<std::optional<int>const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<std::optional<int>const&> *this,
          optional<char> *rhs)

{
  lest *this_00;
  __optional_ne_t<int,_char> _Var1;
  optional<char> *in_R8;
  allocator<char> local_69;
  string local_68;
  string local_48 [32];
  
  _Var1 = std::operator!=(*(optional<int> **)this,rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"!=",&local_69);
  to_string<std::optional<int>,std::optional<char>>
            (&local_68,this_00,(optional<int> *)local_48,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = _Var1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }